

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

char ** parse_path(char *path)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  size_t sVar3;
  char **ppcVar4;
  ulong uVar5;
  char **ppcVar6;
  char **ppcVar7;
  char **local_40;
  char **arr;
  char **ap;
  char *s;
  char *word;
  char *cp;
  size_t len;
  char *path_local;
  
  sVar3 = strlen(path);
  ppcVar4 = (char **)operator_new__(sVar3 + 1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3 + 1;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppcVar6 = (char **)operator_new__(uVar5);
  local_40 = ppcVar6;
  ap = ppcVar4;
  s = (char *)ppcVar4;
  pcVar2 = path;
LAB_0022c5af:
  while ((len = (size_t)pcVar2, *(char *)len == '/' || (*(char *)len == '\0'))) {
    if ((char **)s != ap) {
      ppcVar7 = (char **)((long)ap + 1);
      *(undefined1 *)ap = 0;
      *local_40 = s;
      local_40 = local_40 + 1;
      ap = ppcVar7;
      s = (char *)ppcVar7;
    }
    pcVar2 = (char *)(len + 1);
    if (*(char *)len == '\0') {
      *local_40 = (char *)0x0;
      if ((local_40 == ppcVar6) && (ppcVar4 != (char **)0x0)) {
        operator_delete__(ppcVar4);
      }
      return ppcVar6;
    }
  }
  if (*(char *)len == '\\') goto code_r0x0022c625;
  *(undefined1 *)ap = *(undefined1 *)len;
  len = len + 1;
  goto LAB_0022c687;
code_r0x0022c625:
  pcVar2 = (undefined1 *)(len + 1);
  if (*(char *)(len + 1) != '\0') {
    *(undefined1 *)ap = *(undefined1 *)(len + 1);
    len = len + 2;
LAB_0022c687:
    ap = (char **)((long)ap + 1);
    pcVar2 = (char *)len;
  }
  goto LAB_0022c5af;
}

Assistant:

static char **parse_path(const char *path) {
  size_t len = strlen(path);
  char *cp = new char[(len+1)], *word = cp, *s = cp; // freed below or in free_path()
  char **ap = new char*[(len+1)], **arr = ap;	     // overallocates arr[]
  while (1) {
    if (*path =='/' || *path == 0) {		// handle path sep or eos
      if (word != s) { *s++ = 0; *arr++= word; word = s; }
      if ( !*path++) break; else continue;	// eos? done, else cont
    } else if ( *path == '\\' ) {		// handle escape
      if ( *(++path) ) { *s++ = *path++; } else continue;
    } else { *s++ = *path++; }			// handle normal char
  }
  *arr = 0;
  if ( arr == ap ) delete[] cp;	// empty arr[]? delete since free_path() can't
  return ap;
}